

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

string * __thiscall
cmCTest::GetTestModelString_abi_cxx11_(string *__return_storage_ptr__,cmCTest *this)

{
  ulong uVar1;
  pointer pPVar2;
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  cmCTest *local_18;
  cmCTest *this_local;
  
  local_18 = this;
  this_local = (cmCTest *)__return_storage_ptr__;
  std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->(&this->Impl)
  ;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pPVar2->SpecificTrack);
  }
  else {
    pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    if (pPVar2->TestModel == 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"Nightly",&local_19);
      std::allocator<char>::~allocator(&local_19);
    }
    else if (pPVar2->TestModel == 2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"Continuous",local_2d);
      std::allocator<char>::~allocator(local_2d);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"Experimental",&local_2e);
      std::allocator<char>::~allocator(&local_2e);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::GetTestModelString()
{
  if (!this->Impl->SpecificTrack.empty()) {
    return this->Impl->SpecificTrack;
  }
  switch (this->Impl->TestModel) {
    case cmCTest::NIGHTLY:
      return "Nightly";
    case cmCTest::CONTINUOUS:
      return "Continuous";
  }
  return "Experimental";
}